

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<2>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>
               *condc,ItemNamer *vnam)

{
  double value;
  Buffer<char> *pBVar1;
  size_t sVar2;
  char *__s;
  size_t __n;
  ulong uVar3;
  char *str;
  ptrdiff_t _Num;
  FormatSpec local_48;
  
  __s = ItemNamer::at(vnam,(long)(condc->
                                 super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                                 ).super_FunctionalConstraint.result_var_);
  __n = strlen(__s);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar3 = pBVar1->size_ + __n;
  if (pBVar1->capacity_ < uVar3) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar3);
  }
  if (__n != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,__s,__n);
  }
  pBVar1->size_ = uVar3;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar3 = pBVar1->size_ + 9;
  if (pBVar1->capacity_ < uVar3) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar3);
  }
  builtin_strncpy(pBVar1->ptr_ + pBVar1->size_,"==1 <==> ",9);
  pBVar1->size_ = uVar3;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '(';
  value = (condc->
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
          ).
          super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
          .args_.super_AlgConRhs<2>.rhs_;
  WriteModelItem(wrt,&(condc->
                      super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                      ).
                      super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                      .args_.super_LinTerms,vnam);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ' ';
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar3 = pBVar1->size_ + 1;
  if (pBVar1->capacity_ < uVar3) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar3);
  }
  pBVar1->ptr_[pBVar1->size_] = '>';
  pBVar1->size_ = uVar3;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ' ';
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,value,&local_48);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ')';
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                    const ConditionalConstraint<Con>& condc,
                    ItemNamer& vnam) {
  wrt << vnam.at(condc.GetResultVar()) << "==1 <==> ";
  wrt << '(';
  WriteModelItem(wrt, condc.GetArguments(), vnam);
  wrt << ')';
}